

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

void __thiscall embree::sse2::BVHNBuilderSAHGrid<4>::build(BVHNBuilderSAHGrid<4> *this)

{
  BVH *pBVar1;
  pointer ppTVar2;
  PrimRef *pPVar3;
  GridMesh *pGVar4;
  BVHN<4> *this_00;
  SubGridBuildData *pSVar5;
  double t0;
  double dVar6;
  long lVar7;
  ulong uVar8;
  NodeRef root;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *primrefarray_i;
  MemoryMonitorInterface *pMVar9;
  pointer ppTVar10;
  ulong uVar11;
  size_t sVar12;
  size_t *psVar13;
  float fVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  PrimInfo pinfo;
  
  if ((this->mesh != (GridMesh *)0x0) &&
     ((this->mesh->super_Geometry).numPrimitives != this->numPreviousPrimitives)) {
    pBVar1 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar1->alloc);
    ppTVar2 = (pBVar1->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar10 = (pBVar1->alloc).thread_local_allocators.
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar10 != ppTVar2;
        ppTVar10 = ppTVar10 + 1) {
      FastAllocator::ThreadLocal2::unbind(*ppTVar10,&pBVar1->alloc);
    }
    ppTVar10 = (pBVar1->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar1->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar10) {
      (pBVar1->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar10;
    }
    LOCK();
    (pBVar1->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar1->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar1->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar1->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      FastAllocator::Block::clear_list
                ((pBVar1->alloc).usedBlocks._M_b._M_p,(pBVar1->alloc).device,(pBVar1->alloc).useUSM)
      ;
    }
    LOCK();
    (pBVar1->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar1->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      FastAllocator::Block::clear_list
                ((pBVar1->alloc).freeBlocks._M_b._M_p,(pBVar1->alloc).device,(pBVar1->alloc).useUSM)
      ;
    }
    LOCK();
    (pBVar1->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    for (lVar7 = -0x40; lVar7 != 0; lVar7 = lVar7 + 8) {
      LOCK();
      *(undefined8 *)((long)&(pBVar1->alloc).threadBlocks[0]._M_b._M_p + lVar7) = 0;
      UNLOCK();
      LOCK();
      *(undefined8 *)((long)&(pBVar1->alloc).threadBlocks[8]._M_b._M_p + lVar7) = 0;
      UNLOCK();
    }
    sVar12 = (pBVar1->alloc).primrefarray.size_alloced;
    pPVar3 = (pBVar1->alloc).primrefarray.items;
    if (pPVar3 != (PrimRef *)0x0) {
      if (sVar12 << 5 < 0x1c00000) {
        alignedFree(pPVar3);
      }
      else {
        os_free(pPVar3,sVar12 << 5,(pBVar1->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar12 != 0) {
      pMVar9 = (pBVar1->alloc).primrefarray.alloc.device;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar12 * -0x20,1);
    }
    (pBVar1->alloc).primrefarray.size_active = 0;
    (pBVar1->alloc).primrefarray.size_alloced = 0;
    (pBVar1->alloc).primrefarray.items = (PrimRef *)0x0;
  }
  if ((this->settings).primrefarrayalloc != 0xffffffffffffffff) {
    FastAllocator::unshare(&this->bvh->alloc,(int)this + 0x28);
  }
  pGVar4 = this->mesh;
  if (pGVar4 == (GridMesh *)0x0) {
    this->numPreviousPrimitives = (uint)(this->scene->world).numGrids;
    createPrimRefArrayGrids(&pinfo,this->scene,&this->prims,&this->sgrids);
  }
  else {
    this->numPreviousPrimitives = (pGVar4->super_Geometry).numPrimitives;
    createPrimRefArrayGrids(&pinfo,pGVar4,&this->prims,&this->sgrids);
  }
  this_00 = this->bvh;
  uVar11 = pinfo.end - pinfo.begin;
  if (uVar11 == 0) {
    (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
    sVar12 = (this->prims).size_alloced;
    pPVar3 = (this->prims).items;
    if (pPVar3 != (PrimRef *)0x0) {
      if (sVar12 << 5 < 0x1c00000) {
        alignedFree(pPVar3);
      }
      else {
        os_free(pPVar3,sVar12 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar12 != 0) {
      pMVar9 = (this->prims).alloc.device;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar12 * -0x20,1);
    }
    (this->prims).items = (PrimRef *)0x0;
    (this->prims).size_active = 0;
    (this->prims).size_alloced = 0;
    sVar12 = (this->sgrids).size_alloced;
    pSVar5 = (this->sgrids).items;
    if (pSVar5 != (SubGridBuildData *)0x0) {
      if (sVar12 * 8 < 0x1c00000) {
        alignedFree(pSVar5);
      }
      else {
        os_free(pSVar5,sVar12 * 8,(this->sgrids).alloc.hugepages);
      }
    }
    psVar13 = &(this->sgrids).size_active;
    if (sVar12 == 0) goto LAB_0047776a;
    pMVar9 = (this->sgrids).alloc.device;
    lVar7 = sVar12 << 3;
  }
  else {
    pGVar4 = this->mesh;
    if (pGVar4 == (GridMesh *)0x0) {
      std::__cxx11::to_string(&local_d8,4);
      std::operator+(&local_f8,"sse2::BVH",&local_d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                     &local_f8,"BuilderSAH");
    }
    else {
      std::__cxx11::string::string((string *)&local_b8,"",(allocator *)&local_f8);
    }
    t0 = BVHN<4>::preBuild(this_00,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (pGVar4 == (GridMesh *)0x0) {
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    uVar8 = 0xffffffffffffffff;
    if (999999 < uVar11) {
      uVar8 = uVar11 / 1000;
    }
    (this->settings).primrefarrayalloc = uVar8;
    if (this->mesh != (GridMesh *)0x0) {
      (this->bvh->alloc).atype = EMBREE_OS_MALLOC;
    }
    dVar6 = (double)uVar11 * 1.2 * 0.25 * 88.0;
    uVar8 = (ulong)dVar6;
    sVar12 = (uVar11 * 0xe0 >> 4) +
             ((long)(dVar6 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8);
    FastAllocator::init_estimate(&this->bvh->alloc,sVar12);
    sVar12 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,4,0x400,uVar11,sVar12);
    (this->settings).singleThreadThreshold = sVar12;
    local_b8._8_8_ = this->bvh;
    if (pinfo.end != pinfo.begin) {
      local_a8._M_allocated_capacity = (size_type)(this->sgrids).items;
      local_b8._0_8_ = &PTR_createLeaf_021dc5b0;
      root = BVHNBuilderVirtual<4>::BVHNBuilderV::build
                       ((BVHNBuilderV *)&local_b8,&((BVH *)local_b8._8_8_)->alloc,
                        &(((BVH *)local_b8._8_8_)->scene->progressInterface).
                         super_BuildProgressMonitor,(this->prims).items,&pinfo,this->settings);
      local_b8._0_8_ =
           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
      local_b8._8_8_ =
           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
      local_a8._M_allocated_capacity =
           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
      local_a8._8_8_ =
           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
      local_98._0_8_ =
           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
      local_98._8_8_ =
           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
      local_88._0_8_ =
           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
      local_88._8_8_ =
           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
      BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_b8,pinfo.end - pinfo.begin);
      fVar14 = (float)(pinfo.end - pinfo.begin) * 0.005;
      uVar11 = (ulong)fVar14;
      ctx = (EVP_PKEY_CTX *)((long)(fVar14 - 9.223372e+18) & (long)uVar11 >> 0x3f | uVar11);
      BVHN<4>::layoutLargeNodes(this->bvh,(size_t)ctx);
      sVar12 = (this->sgrids).size_alloced;
      pSVar5 = (this->sgrids).items;
      if (pSVar5 != (SubGridBuildData *)0x0) {
        ctx = (EVP_PKEY_CTX *)(sVar12 * 8);
        if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
          alignedFree(pSVar5);
        }
        else {
          os_free(pSVar5,(size_t)ctx,(this->sgrids).alloc.hugepages);
        }
      }
      if (sVar12 != 0) {
        pMVar9 = (this->sgrids).alloc.device;
        ctx = (EVP_PKEY_CTX *)(sVar12 * -8);
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,ctx,1);
      }
      primrefarray_i = (EVP_PKEY_CTX *)&this->prims;
      (this->sgrids).items = (SubGridBuildData *)0x0;
      (this->sgrids).size_active = 0;
      (this->sgrids).size_alloced = 0;
      if ((this->settings).primrefarrayalloc == 0xffffffffffffffff) {
        if ((this->scene != (Scene *)0x0) &&
           ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
          sVar12 = (this->prims).size_alloced;
          pPVar3 = (this->prims).items;
          if (pPVar3 != (PrimRef *)0x0) {
            ctx = (EVP_PKEY_CTX *)(sVar12 << 5);
            if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
              alignedFree(pPVar3);
            }
            else {
              os_free(pPVar3,(size_t)ctx,(this->prims).alloc.hugepages);
            }
          }
          if (sVar12 != 0) {
            pMVar9 = (((mvector<PrimRef> *)primrefarray_i)->alloc).device;
            ctx = (EVP_PKEY_CTX *)(sVar12 * -0x20);
            (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,ctx,1);
          }
          (this->prims).size_active = 0;
          (this->prims).size_alloced = 0;
          (this->prims).items = (PrimRef *)0x0;
        }
      }
      else {
        FastAllocator::share(&this->bvh->alloc,(mvector<PrimRef> *)primrefarray_i);
        ctx = primrefarray_i;
      }
      BVHN<4>::cleanup(this->bvh,ctx);
      BVHN<4>::postBuild(this->bvh,t0);
      return;
    }
    (*(((BVH *)local_b8._8_8_)->super_AccelData).super_RefCount._vptr_RefCount[5])();
    sVar12 = (this->sgrids).size_alloced;
    pSVar5 = (this->sgrids).items;
    if (pSVar5 != (SubGridBuildData *)0x0) {
      if (sVar12 * 8 < 0x1c00000) {
        alignedFree(pSVar5);
      }
      else {
        os_free(pSVar5,sVar12 * 8,(this->sgrids).alloc.hugepages);
      }
    }
    if (sVar12 != 0) {
      pMVar9 = (this->sgrids).alloc.device;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar12 * -8,1);
    }
    (this->sgrids).items = (SubGridBuildData *)0x0;
    (this->sgrids).size_active = 0;
    (this->sgrids).size_alloced = 0;
    sVar12 = (this->prims).size_alloced;
    pPVar3 = (this->prims).items;
    if (pPVar3 != (PrimRef *)0x0) {
      if (sVar12 << 5 < 0x1c00000) {
        alignedFree(pPVar3);
      }
      else {
        os_free(pPVar3,sVar12 << 5,(this->prims).alloc.hugepages);
      }
    }
    psVar13 = &(this->prims).size_active;
    if (sVar12 == 0) goto LAB_0047776a;
    pMVar9 = (this->prims).alloc.device;
    lVar7 = sVar12 << 5;
  }
  (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,-lVar7,1);
LAB_0047776a:
  *psVar13 = 0;
  psVar13[1] = 0;
  psVar13[2] = 0;
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }
        
        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.unshare(prims);

        const size_t numGridPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(GridMesh::geom_type,false);
        numPreviousPrimitives = numGridPrimitives;


        PrimInfo pinfo = mesh ? createPrimRefArrayGrids(mesh,prims,sgrids) : createPrimRefArrayGrids(scene,prims,sgrids);
        const size_t numPrimitives = pinfo.size();
        /* no primitives */
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          sgrids.clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + "BuilderSAH");

        /* create primref array */
        settings.primrefarrayalloc = numPrimitives/1000;
        if (settings.primrefarrayalloc < 1000)
          settings.primrefarrayalloc = inf;

        /* enable os_malloc for two level build */
        if (mesh)
          bvh->alloc.setOSallocation(true);

        /* initialize allocator */
        const size_t node_bytes = numPrimitives*sizeof(typename BVH::AABBNodeMB)/(4*N);
        const size_t leaf_bytes = size_t(1.2*(float)numPrimitives/N * sizeof(SubGridQBVHN<N>));

        bvh->alloc.init_estimate(node_bytes+leaf_bytes);
        settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);

        /* pinfo might has zero size due to invalid geometry */
        if (unlikely(pinfo.size() == 0))
        {
          bvh->clear();
          sgrids.clear();
          prims.clear();
          return;
        }

        /* call BVH builder */
        NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeafGrid<N,SubGridQBVHN<N>>(bvh,sgrids.data()),bvh->scene->progressInterface,prims.data(),pinfo,settings);
        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

        /* clear temporary array */
        sgrids.clear();

        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.share(prims);

        /* for static geometries we can do some cleanups */
        else if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }